

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketManager.cpp
# Opt level: O3

void __thiscall SocketManager::SMMLF::server(SMMLF *this)

{
  pointer pcVar1;
  int __fd;
  SocketOnline *this_00;
  int iVar2;
  uint uVar3;
  sockaddr_in clnt_addr;
  char buffer [101];
  socklen_t local_cc;
  string local_c8;
  sockaddr local_a8;
  char local_98 [104];
  
  pcVar1 = (this->ip)._M_dataplus._M_p;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar1,pcVar1 + (this->ip)._M_string_length);
  server_init(&this->serv_sock,&local_c8,node_type + this->port);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (node_type < 2) {
    iVar2 = node_type + -2;
    do {
      local_cc = 0x10;
      __fd = accept(this->serv_sock,&local_a8,&local_cc);
      puts("accept");
      this->sock = __fd;
      read(__fd,local_98,1);
      uVar3 = (uint)local_98[0];
      printf("Message form client %d: %c\n",(ulong)(uVar3 - 0x30),(ulong)uVar3);
      this_00 = (SocketOnline *)operator_new(0x28);
      SocketOnline::SocketOnline(this_00,uVar3 - 0x30,this->sock);
      *(SocketOnline **)((long)node_type * 0x18 + 0x12e510 + (long)(int)uVar3 * 8) = this_00;
      *(SOCK *)((long)this + (long)(int)uVar3 * 4 + -0x98) = this->sock;
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void SocketManager::SMMLF::server() {
    server_init(serv_sock, ip, port + node_type);
    char buffer[101];
    for (int i = node_type + 1; i < M; i++) {
        sock = accept_sock(serv_sock);
#ifdef UNIX_PLATFORM
        read(sock, buffer, 1);
#else
        recv(sock, buffer, 1, NULL);
#endif
        printf("Message form client %d: %c\n", buffer[0]-'0', buffer[0]);
        socket_io[node_type][buffer[0]-'0'] = new SocketOnline(buffer[0]-'0', sock);
        clnt_sock[buffer[0]-'0'] = sock;
    }
}